

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  int iVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *palVar13;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  int iVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  __m128i *ptr_02;
  uint uVar18;
  char *__format;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  ulong size;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  ulong uVar26;
  __m128i alVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar29 [16];
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar40;
  ulong uVar38;
  uint uVar41;
  uint uVar42;
  __m128i alVar39;
  int32_t iVar43;
  int iVar44;
  int iVar45;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined1 auVar46 [16];
  uint uVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar28 = profile->s1Len;
        if ((int)uVar28 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            uVar10 = uVar28 - 1;
            size = (ulong)uVar28 + 3 >> 2;
            uVar26 = (ulong)uVar10 % size;
            iVar23 = -open;
            iVar20 = ppVar6->min;
            uVar18 = 0x80000000 - iVar20;
            if (iVar20 != iVar23 && SBORROW4(iVar20,iVar23) == iVar20 + open < 0) {
              uVar18 = open | 0x80000000;
            }
            uVar11 = 0x7ffffffe - ppVar6->max;
            ppVar12 = parasail_result_new_rowcol1((uint)((ulong)uVar28 + 3) & 0x7ffffffc,s2Len);
            if (ppVar12 != (parasail_result_t *)0x0) {
              ppVar12->flag = ppVar12->flag | 0x4440801;
              palVar13 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar13 != (__m128i *)0x0)) {
                iVar14 = s2Len + -1;
                iVar17 = 3 - (int)(uVar10 / size);
                uVar18 = uVar18 + 1;
                iVar22 = (int)size;
                iVar20 = iVar23;
                for (uVar19 = 0; uVar19 != size; uVar19 = uVar19 + 1) {
                  iVar24 = iVar20;
                  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                    lVar21 = (long)iVar24 - (ulong)(uint)open;
                    if (lVar21 < -0x7fffffff) {
                      lVar21 = -0x80000000;
                    }
                    *(int *)((long)&h + lVar15 * 4) = iVar24;
                    *(int *)((long)&e + lVar15 * 4) = (int)lVar21;
                    iVar24 = iVar24 - gap * iVar22;
                  }
                  palVar13[uVar19][0] = h.m[0];
                  palVar13[uVar19][1] = h.m[1];
                  ptr_00[uVar19][0] = e.m[0];
                  ptr_00[uVar19][1] = e.m[1];
                  iVar20 = iVar20 - gap;
                }
                *ptr_01 = 0;
                for (uVar19 = 1; s2Len + 1 != uVar19; uVar19 = uVar19 + 1) {
                  ptr_01[uVar19] = iVar23;
                  iVar23 = iVar23 - gap;
                }
                uVar19 = 0;
                uVar28 = uVar18;
                uVar30 = uVar18;
                uVar31 = uVar18;
                uVar32 = uVar18;
                uVar33 = uVar11;
                uVar34 = uVar11;
                uVar35 = uVar11;
                uVar36 = uVar11;
                do {
                  ptr_02 = palVar13;
                  if (uVar19 == (uint)s2Len) {
                    for (lVar15 = 0; size * 4 != lVar15; lVar15 = lVar15 + 4) {
                      puVar3 = (undefined4 *)((long)*ptr_02 + lVar15 * 4);
                      uVar7 = puVar3[1];
                      uVar8 = puVar3[2];
                      uVar9 = puVar3[3];
                      piVar1 = ((ppVar12->field_4).rowcols)->score_col;
                      *(undefined4 *)((long)piVar1 + lVar15) = *puVar3;
                      *(undefined4 *)((long)piVar1 + size * 4 + lVar15) = uVar7;
                      *(undefined4 *)((long)piVar1 + size * 8 + lVar15) = uVar8;
                      *(undefined4 *)((long)piVar1 + size * 0xc + lVar15) = uVar9;
                    }
                    alVar27 = ptr_02[uVar26];
                    iVar20 = 0;
                    while( true ) {
                      uVar26 = alVar27[0];
                      lVar15 = alVar27[1];
                      if (iVar17 <= iVar20) break;
                      alVar27[0] = uVar26 << 0x20;
                      alVar27[1] = lVar15 << 0x20 | uVar26 >> 0x20;
                      iVar20 = iVar20 + 1;
                    }
                    auVar25._0_4_ = -(uint)((int)uVar33 < (int)uVar18);
                    auVar25._4_4_ = -(uint)((int)uVar34 < (int)uVar18);
                    auVar25._8_4_ = -(uint)((int)uVar35 < (int)uVar18);
                    auVar25._12_4_ = -(uint)((int)uVar36 < (int)uVar18);
                    auVar29._0_4_ = -(uint)((int)uVar11 < (int)uVar28);
                    auVar29._4_4_ = -(uint)((int)uVar11 < (int)uVar30);
                    auVar29._8_4_ = -(uint)((int)uVar11 < (int)uVar31);
                    auVar29._12_4_ = -(uint)((int)uVar11 < (int)uVar32);
                    iVar20 = movmskps(iVar20,auVar29 | auVar25);
                    if (iVar20 == 0) {
                      iVar20 = alVar27[1]._4_4_;
                    }
                    else {
                      *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                      iVar20 = 0;
                      iVar14 = 0;
                      uVar10 = 0;
                    }
                    ppVar12->score = iVar20;
                    ppVar12->end_query = uVar10;
                    ppVar12->end_ref = iVar14;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar12;
                  }
                  iVar4 = ppVar6->mapper[(byte)s2[uVar19]];
                  palVar13 = ptr_02 + (iVar22 - 1);
                  iVar20 = (int)(*palVar13)[0];
                  iVar23 = *(int *)((long)*palVar13 + 4);
                  iVar24 = (int)(*palVar13)[1];
                  iVar43 = ptr_01[uVar19];
                  uVar37 = uVar18;
                  uVar40 = uVar18;
                  uVar41 = uVar18;
                  uVar42 = uVar18;
                  for (lVar15 = 0; size * 0x10 != lVar15; lVar15 = lVar15 + 0x10) {
                    piVar1 = (int *)((long)pvVar5 + lVar15 + (long)(iVar4 * iVar22) * 0x10);
                    iVar44 = iVar43 + *piVar1;
                    iVar20 = iVar20 + piVar1[1];
                    iVar23 = iVar23 + piVar1[2];
                    iVar24 = iVar24 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar15);
                    iVar45 = *piVar1;
                    iVar47 = piVar1[1];
                    iVar48 = piVar1[2];
                    iVar49 = piVar1[3];
                    uVar50 = (iVar45 < (int)uVar37) * uVar37 |
                             (uint)(iVar45 >= (int)uVar37) * iVar45;
                    uVar51 = (iVar47 < (int)uVar40) * uVar40 |
                             (uint)(iVar47 >= (int)uVar40) * iVar47;
                    uVar53 = (iVar48 < (int)uVar41) * uVar41 |
                             (uint)(iVar48 >= (int)uVar41) * iVar48;
                    uVar55 = (iVar49 < (int)uVar42) * uVar42 |
                             (uint)(iVar49 >= (int)uVar42) * iVar49;
                    uVar50 = (uint)((int)uVar50 < iVar44) * iVar44 |
                             ((int)uVar50 >= iVar44) * uVar50;
                    uVar51 = (uint)((int)uVar51 < iVar20) * iVar20 |
                             ((int)uVar51 >= iVar20) * uVar51;
                    uVar53 = (uint)((int)uVar53 < iVar23) * iVar23 |
                             ((int)uVar53 >= iVar23) * uVar53;
                    uVar55 = (uint)((int)uVar55 < iVar24) * iVar24 |
                             ((int)uVar55 >= iVar24) * uVar55;
                    puVar2 = (uint *)((long)*ptr + lVar15);
                    *puVar2 = uVar50;
                    puVar2[1] = uVar51;
                    puVar2[2] = uVar53;
                    puVar2[3] = uVar55;
                    uVar28 = ((int)uVar28 < (int)uVar50) * uVar50 |
                             ((int)uVar28 >= (int)uVar50) * uVar28;
                    uVar30 = ((int)uVar30 < (int)uVar51) * uVar51 |
                             ((int)uVar30 >= (int)uVar51) * uVar30;
                    uVar31 = ((int)uVar31 < (int)uVar53) * uVar53 |
                             ((int)uVar31 >= (int)uVar53) * uVar31;
                    uVar32 = ((int)uVar32 < (int)uVar55) * uVar55 |
                             ((int)uVar32 >= (int)uVar55) * uVar32;
                    uVar33 = (uint)(iVar45 < (int)uVar33) * iVar45 |
                             (iVar45 >= (int)uVar33) * uVar33;
                    uVar34 = (uint)(iVar47 < (int)uVar34) * iVar47 |
                             (iVar47 >= (int)uVar34) * uVar34;
                    uVar35 = (uint)(iVar48 < (int)uVar35) * iVar48 |
                             (iVar48 >= (int)uVar35) * uVar35;
                    uVar36 = (uint)(iVar49 < (int)uVar36) * iVar49 |
                             (iVar49 >= (int)uVar36) * uVar36;
                    uVar33 = ((int)uVar37 < (int)uVar33) * uVar37 |
                             ((int)uVar37 >= (int)uVar33) * uVar33;
                    uVar34 = ((int)uVar40 < (int)uVar34) * uVar40 |
                             ((int)uVar40 >= (int)uVar34) * uVar34;
                    uVar35 = ((int)uVar41 < (int)uVar35) * uVar41 |
                             ((int)uVar41 >= (int)uVar35) * uVar35;
                    uVar36 = ((int)uVar42 < (int)uVar36) * uVar42 |
                             ((int)uVar42 >= (int)uVar36) * uVar36;
                    uVar33 = ((int)uVar50 < (int)uVar33) * uVar50 |
                             ((int)uVar50 >= (int)uVar33) * uVar33;
                    uVar34 = ((int)uVar51 < (int)uVar34) * uVar51 |
                             ((int)uVar51 >= (int)uVar34) * uVar34;
                    uVar35 = ((int)uVar53 < (int)uVar35) * uVar53 |
                             ((int)uVar53 >= (int)uVar35) * uVar35;
                    uVar36 = ((int)uVar55 < (int)uVar36) * uVar55 |
                             ((int)uVar55 >= (int)uVar36) * uVar36;
                    iVar44 = uVar50 - open;
                    iVar52 = uVar51 - open;
                    iVar54 = uVar53 - open;
                    iVar56 = uVar55 - open;
                    iVar45 = iVar45 - gap;
                    iVar47 = iVar47 - gap;
                    iVar48 = iVar48 - gap;
                    iVar49 = iVar49 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar15);
                    *puVar2 = (uint)(iVar45 < iVar44) * iVar44 | (uint)(iVar45 >= iVar44) * iVar45;
                    puVar2[1] = (uint)(iVar47 < iVar52) * iVar52 | (uint)(iVar47 >= iVar52) * iVar47
                    ;
                    puVar2[2] = (uint)(iVar48 < iVar54) * iVar54 | (uint)(iVar48 >= iVar54) * iVar48
                    ;
                    puVar2[3] = (uint)(iVar49 < iVar56) * iVar56 | (uint)(iVar49 >= iVar56) * iVar49
                    ;
                    iVar20 = uVar37 - gap;
                    iVar23 = uVar40 - gap;
                    iVar24 = uVar41 - gap;
                    iVar45 = uVar42 - gap;
                    uVar37 = (uint)(iVar20 < iVar44) * iVar44 | (uint)(iVar20 >= iVar44) * iVar20;
                    uVar40 = (uint)(iVar23 < iVar52) * iVar52 | (uint)(iVar23 >= iVar52) * iVar23;
                    uVar41 = (uint)(iVar24 < iVar54) * iVar54 | (uint)(iVar24 >= iVar54) * iVar24;
                    uVar42 = (uint)(iVar45 < iVar56) * iVar56 | (uint)(iVar45 >= iVar56) * iVar45;
                    piVar1 = (int *)((long)*ptr_02 + lVar15);
                    iVar43 = *piVar1;
                    iVar20 = piVar1[1];
                    iVar23 = piVar1[2];
                    iVar24 = piVar1[3];
                  }
                  pcVar16 = s2;
                  for (iVar20 = 0; iVar20 != 4; iVar20 = iVar20 + 1) {
                    lVar15 = 0;
                    uVar42 = ptr_01[uVar19 + 1] - open;
                    uVar50 = uVar41;
                    while (uVar41 = uVar40, uVar40 = uVar37, uVar37 = uVar42,
                          size * 0x10 + 0x10 != lVar15 + 0x10) {
                      piVar1 = (int *)((long)*ptr + lVar15);
                      iVar23 = *piVar1;
                      iVar24 = piVar1[1];
                      iVar4 = piVar1[2];
                      iVar45 = piVar1[3];
                      uVar42 = (iVar23 < (int)uVar37) * uVar37 |
                               (uint)(iVar23 >= (int)uVar37) * iVar23;
                      uVar51 = (iVar24 < (int)uVar40) * uVar40 |
                               (uint)(iVar24 >= (int)uVar40) * iVar24;
                      uVar53 = (iVar4 < (int)uVar41) * uVar41 | (uint)(iVar4 >= (int)uVar41) * iVar4
                      ;
                      uVar55 = (iVar45 < (int)uVar50) * uVar50 |
                               (uint)(iVar45 >= (int)uVar50) * iVar45;
                      puVar2 = (uint *)((long)*ptr + lVar15);
                      *puVar2 = uVar42;
                      puVar2[1] = uVar51;
                      puVar2[2] = uVar53;
                      puVar2[3] = uVar55;
                      uVar33 = ((int)uVar42 < (int)uVar33) * uVar42 |
                               ((int)uVar42 >= (int)uVar33) * uVar33;
                      uVar34 = ((int)uVar51 < (int)uVar34) * uVar51 |
                               ((int)uVar51 >= (int)uVar34) * uVar34;
                      uVar35 = ((int)uVar53 < (int)uVar35) * uVar53 |
                               ((int)uVar53 >= (int)uVar35) * uVar35;
                      uVar36 = ((int)uVar55 < (int)uVar36) * uVar55 |
                               ((int)uVar55 >= (int)uVar36) * uVar36;
                      uVar28 = ((int)uVar28 < (int)uVar42) * uVar42 |
                               ((int)uVar28 >= (int)uVar42) * uVar28;
                      uVar30 = ((int)uVar30 < (int)uVar51) * uVar51 |
                               ((int)uVar30 >= (int)uVar51) * uVar30;
                      uVar31 = ((int)uVar31 < (int)uVar53) * uVar53 |
                               ((int)uVar31 >= (int)uVar53) * uVar31;
                      uVar32 = ((int)uVar32 < (int)uVar55) * uVar55 |
                               ((int)uVar32 >= (int)uVar55) * uVar32;
                      uVar50 = uVar50 - gap;
                      auVar46._0_4_ = -(uint)((int)(uVar42 - open) < (int)(uVar37 - gap));
                      auVar46._4_4_ = -(uint)((int)(uVar51 - open) < (int)(uVar40 - gap));
                      auVar46._8_4_ = -(uint)((int)(uVar53 - open) < (int)(uVar41 - gap));
                      auVar46._12_4_ = -(uint)((int)(uVar55 - open) < (int)uVar50);
                      uVar51 = movmskps((int)pcVar16,auVar46);
                      pcVar16 = (char *)(ulong)uVar51;
                      lVar15 = lVar15 + 0x10;
                      uVar42 = uVar37 - gap;
                      uVar37 = uVar40 - gap;
                      uVar40 = uVar41 - gap;
                      if (uVar51 == 0) goto LAB_006b4233;
                    }
                  }
LAB_006b4233:
                  alVar39 = ptr[uVar26];
                  iVar20 = 0;
                  while( true ) {
                    uVar38 = alVar39[0];
                    lVar15 = alVar39[1];
                    if (iVar17 <= iVar20) break;
                    alVar39[0] = uVar38 << 0x20;
                    alVar39[1] = lVar15 << 0x20 | uVar38 >> 0x20;
                    iVar20 = iVar20 + 1;
                  }
                  ((ppVar12->field_4).rowcols)->score_row[uVar19] = alVar39[1]._4_4_;
                  uVar19 = uVar19 + 1;
                  palVar13 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_striped_profile_sse41_128_32",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}